

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.h
# Opt level: O2

bool llvm::detail::to_float<float>(Twine *T,float *Num,_func_float_char_ptr_char_ptr_ptr *StrTo)

{
  char cVar1;
  float fVar2;
  StringRef SVar3;
  undefined1 local_50 [8];
  SmallString<32U> Storage;
  char *End;
  
  local_50 = (undefined1  [8])
             &Storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Size;
  Storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x2000000000;
  SVar3 = Twine::toNullTerminatedStringRef(T,(SmallVectorImpl<char> *)local_50);
  fVar2 = (*StrTo)(SVar3.Data,
                   (char **)(Storage.super_SmallVector<char,_32U>.
                             super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
  cVar1 = *(char *)Storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                   InlineElts._24_8_;
  if (cVar1 == '\0') {
    *Num = fVar2;
  }
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_50);
  return cVar1 == '\0';
}

Assistant:

inline bool to_float(const Twine &T, N &Num, N (*StrTo)(const char *, char **)) {
  SmallString<32> Storage;
  StringRef S = T.toNullTerminatedStringRef(Storage);
  char *End;
  N Temp = StrTo(S.data(), &End);
  if (*End != '\0')
    return false;
  Num = Temp;
  return true;
}